

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

int on_stream_close(nghttp2_session *session,int32_t stream_id,uint32_t error_code,void *userp)

{
  size_t *psVar1;
  HTTP *pHVar2;
  bool bVar3;
  int iVar4;
  int extraout_EAX;
  Curl_easy *data;
  connectdata *conn;
  
  if (stream_id == 0) {
    return 0;
  }
  data = (Curl_easy *)nghttp2_session_get_stream_user_data(session,stream_id);
  if (data == (Curl_easy *)0x0) {
    iVar4 = 0;
  }
  else {
    pHVar2 = (data->req).p.http;
    if (pHVar2 != (HTTP *)0x0) {
      pHVar2->closed = true;
      psVar1 = &(data->state).drain;
      *psVar1 = *psVar1 + 1;
      *(long *)((long)userp + 0x4e0) = *(long *)((long)userp + 0x4e0) + 1;
      Curl_expire(data,0,EXPIRE_RUN_NOW);
      pHVar2->error = error_code;
      iVar4 = nghttp2_session_set_stream_user_data(session,stream_id,(void *)0x0);
      if (iVar4 != 0) {
        Curl_infof(data,"http/2: failed to clear user_data for stream %u",stream_id);
        iVar4 = extraout_EAX;
      }
      if (*(int *)((long)userp + 0x4d8) == stream_id) {
        *(undefined4 *)((long)userp + 0x4d8) = 0;
      }
      pHVar2->stream_id = 0;
      bVar3 = true;
      goto LAB_0052fcab;
    }
    iVar4 = -0x386;
  }
  bVar3 = false;
LAB_0052fcab:
  if (bVar3) {
    return 0;
  }
  return iVar4;
}

Assistant:

static int on_stream_close(nghttp2_session *session, int32_t stream_id,
                           uint32_t error_code, void *userp)
{
  struct Curl_easy *data_s;
  struct HTTP *stream;
  struct connectdata *conn = (struct connectdata *)userp;
  int rv;
  (void)session;
  (void)stream_id;

  if(stream_id) {
    struct http_conn *httpc;
    /* get the stream from the hash based on Stream ID, stream ID zero is for
       connection-oriented stuff */
    data_s = nghttp2_session_get_stream_user_data(session, stream_id);
    if(!data_s) {
      /* We could get stream ID not in the hash.  For example, if we
         decided to reject stream (e.g., PUSH_PROMISE). */
      return 0;
    }
    H2BUGF(infof(data_s, "on_stream_close(), %s (err %d), stream %u",
                 nghttp2_http2_strerror(error_code), error_code, stream_id));
    stream = data_s->req.p.http;
    if(!stream)
      return NGHTTP2_ERR_CALLBACK_FAILURE;

    stream->closed = TRUE;
    httpc = &conn->proto.httpc;
    drain_this(data_s, httpc);
    Curl_expire(data_s, 0, EXPIRE_RUN_NOW);
    stream->error = error_code;

    /* remove the entry from the hash as the stream is now gone */
    rv = nghttp2_session_set_stream_user_data(session, stream_id, 0);
    if(rv) {
      infof(data_s, "http/2: failed to clear user_data for stream %u",
            stream_id);
      DEBUGASSERT(0);
    }
    if(stream_id == httpc->pause_stream_id) {
      H2BUGF(infof(data_s, "Stopped the pause stream"));
      httpc->pause_stream_id = 0;
    }
    H2BUGF(infof(data_s, "Removed stream %u hash", stream_id));
    stream->stream_id = 0; /* cleared */
  }
  return 0;
}